

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_conn.c
# Opt level: O3

nng_err nni_http_copy_body(nng_http *conn,void *data,size_t size)

{
  char *__s;
  nng_err nVar1;
  nni_http_entity *entity;
  nng_http_res *pnVar2;
  
  entity = &(conn->res).data;
  if (conn->client != false) {
    entity = &(conn->req).data;
  }
  nVar1 = http_copy_data(entity,data,size);
  if (nVar1 == NNG_OK) {
    pnVar2 = &conn->res;
    if (conn->client != false) {
      pnVar2 = (nng_http_res *)&conn->req;
    }
    __s = (pnVar2->data).clen;
    snprintf(__s,0x18,"%lu",size);
    nni_http_set_static_header(conn,&(pnVar2->data).content_length,"Content-Length",__s);
  }
  return nVar1;
}

Assistant:

nng_err
nni_http_copy_body(nng_http *conn, const void *data, size_t size)
{
	nng_err rv;
	if (conn->client) {
		rv = http_copy_data(&conn->req.data, data, size);
	} else {
		rv = http_copy_data(&conn->res.data, data, size);
	}
	if (rv == NNG_OK) {
		nni_http_set_content_length(conn, size);
	}
	return (rv);
}